

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

aom_fixed_buf_t * av1_get_global_headers(AV1_PRIMARY *ppi)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  size_t available;
  uint8_t *coded_value;
  aom_fixed_buf_t *__ptr;
  size_t __size;
  void *pvVar4;
  long in_RDI;
  size_t global_header_buf_size;
  aom_fixed_buf_t *global_headers;
  size_t coded_size_field_size;
  size_t payload_offset;
  size_t size_field_size;
  size_t obu_header_size;
  uint32_t sequence_header_size;
  uint8_t header_buf [512];
  size_t in_stack_fffffffffffffdc0;
  uint8_t *in_stack_fffffffffffffdc8;
  SequenceHeader *in_stack_fffffffffffffdd0;
  uint64_t value;
  uint8_t local_218;
  uint8_t auStack_217 [519];
  long local_10;
  aom_fixed_buf_t *local_8;
  
  if (in_RDI == 0) {
    local_8 = (aom_fixed_buf_t *)0x0;
  }
  else {
    local_10 = in_RDI;
    memset(&local_218,0,0x200);
    uVar1 = av1_write_sequence_header_obu
                      (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0
                      );
    if (uVar1 == 0) {
      local_8 = (aom_fixed_buf_t *)0x0;
    }
    else {
      value = 1;
      available = aom_uleb_size_in_bytes((ulong)uVar1);
      coded_value = (uint8_t *)(available + 1);
      if (coded_value + uVar1 < (uint8_t *)0x201) {
        memmove(&local_218 + (long)coded_value,&local_218,(ulong)uVar1);
        uVar2 = av1_write_obu_header
                          ((AV1LevelParams *)(local_10 + 0x5a90),
                           (int *)(*(long *)(local_10 + 0x160) + 0x9d300),OBU_SEQUENCE_HEADER,
                           (_Bool)(*(byte *)(local_10 + 0xc0ac) & 1),false,0,&local_218);
        if (uVar2 == 1) {
          iVar3 = aom_uleb_encode(value,available,coded_value,(size_t *)0x0);
          if (iVar3 == 0) {
            __ptr = (aom_fixed_buf_t *)malloc(0x10);
            if (__ptr == (aom_fixed_buf_t *)0x0) {
              local_8 = (aom_fixed_buf_t *)0x0;
            }
            else {
              __size = available + 1 + (ulong)uVar1;
              pvVar4 = malloc(__size);
              __ptr->buf = pvVar4;
              if (__ptr->buf == (void *)0x0) {
                free(__ptr);
                local_8 = (aom_fixed_buf_t *)0x0;
              }
              else {
                memcpy(__ptr->buf,&local_218,__size);
                __ptr->sz = __size;
                local_8 = __ptr;
              }
            }
          }
          else {
            local_8 = (aom_fixed_buf_t *)0x0;
          }
        }
        else {
          local_8 = (aom_fixed_buf_t *)0x0;
        }
      }
      else {
        local_8 = (aom_fixed_buf_t *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

aom_fixed_buf_t *av1_get_global_headers(AV1_PRIMARY *ppi) {
  if (!ppi) return NULL;

  uint8_t header_buf[512] = { 0 };
  const uint32_t sequence_header_size = av1_write_sequence_header_obu(
      &ppi->seq_params, &header_buf[0], sizeof(header_buf));
  assert(sequence_header_size <= sizeof(header_buf));
  if (sequence_header_size == 0) return NULL;

  const size_t obu_header_size = 1;
  const size_t size_field_size = aom_uleb_size_in_bytes(sequence_header_size);
  const size_t payload_offset = obu_header_size + size_field_size;

  if (payload_offset + sequence_header_size > sizeof(header_buf)) return NULL;
  memmove(&header_buf[payload_offset], &header_buf[0], sequence_header_size);

  if (av1_write_obu_header(&ppi->level_params, &ppi->cpi->frame_header_count,
                           OBU_SEQUENCE_HEADER,
                           ppi->seq_params.has_nonzero_operating_point_idc,
                           /*is_layer_specific_obu=*/false, 0,
                           &header_buf[0]) != obu_header_size) {
    return NULL;
  }

  size_t coded_size_field_size = 0;
  if (aom_uleb_encode(sequence_header_size, size_field_size,
                      &header_buf[obu_header_size],
                      &coded_size_field_size) != 0) {
    return NULL;
  }
  assert(coded_size_field_size == size_field_size);

  aom_fixed_buf_t *global_headers =
      (aom_fixed_buf_t *)malloc(sizeof(*global_headers));
  if (!global_headers) return NULL;

  const size_t global_header_buf_size =
      obu_header_size + size_field_size + sequence_header_size;

  global_headers->buf = malloc(global_header_buf_size);
  if (!global_headers->buf) {
    free(global_headers);
    return NULL;
  }

  memcpy(global_headers->buf, &header_buf[0], global_header_buf_size);
  global_headers->sz = global_header_buf_size;
  return global_headers;
}